

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcEmbedTokenList::unget(CTcEmbedTokenList *this,int n,int m)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  CTcTokenEle *ele;
  CTcToken *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 uVar1;
  int local_1c;
  CTcTokenEle *local_18;
  int local_10;
  
  local_18 = CTcTokenEle::getprv(*(CTcTokenEle **)(in_RDI + 8));
  local_1c = *(int *)(in_RDI + 0x10);
  for (local_10 = in_EDX; uVar1 = local_10 != 0 && local_18 != (CTcTokenEle *)0x0,
      local_10 != 0 && local_18 != (CTcTokenEle *)0x0; local_10 = local_10 + -1) {
    local_18 = CTcTokenEle::getprv(local_18);
    local_1c = local_1c + -1;
  }
  for (; local_18 != (CTcTokenEle *)0x0 && in_ESI < local_1c; local_1c = local_1c + -1) {
    CTcTokenizer::unget((CTcTokenizer *)
                        CONCAT17(uVar1,CONCAT16(local_18 != (CTcTokenEle *)0x0 && in_ESI < local_1c,
                                                in_stack_ffffffffffffffd0)),
                        in_stack_ffffffffffffffc8);
    local_18 = CTcTokenEle::getprv(local_18);
  }
  return;
}

Assistant:

void unget(int n = 0, int m = 0)
    {
        /* skip the last 'm' tokens */
        CTcTokenEle *ele;
        int i;
        for (ele = wrt->getprv(), i = cnt ; m != 0 && ele != 0 ;
             ele = ele->getprv(), --m, --i) ;

        /* unget tokens until we're down to the first 'n' */
        for ( ; ele != 0 && i > n ; ele = ele->getprv(), --i)
            G_tok->unget(ele);
    }